

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_ready(MppBufSlots slots)

{
  __pthread_internal_list *p_Var1;
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_ready");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((buf_slot_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_buf_slot","slot %p is ready now\n",(char *)0x0,slots);
    }
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_30,*slots,1);
    if (auto_lock.mLock[5].mMutex.__data.__list.__next == (__pthread_internal_list *)0x0) {
      _dump_slots("mpp_buf_slot_ready",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                 "mpp_buf_slot_ready",0x3b4);
      abort();
    }
    if (*(int *)((long)&(auto_lock.mLock)->mMutex + 0x18) == 0) {
      _mpp_log_l(4,"mpp_buf_slot","found info change ready set without internal info change\n",
                 (char *)0x0);
    }
    if (auto_lock.mLock[2].mMutex.__data.__kind != *(int *)((long)&(auto_lock.mLock)->mMutex + 0x20)
       ) {
      p_Var1 = (__pthread_internal_list *)
               mpp_osal_realloc("mpp_buf_slot_ready",auto_lock.mLock[5].mMutex.__data.__list.__next,
                                (long)*(int *)((long)&(auto_lock.mLock)->mMutex + 0x20) * 0x38);
      auto_lock.mLock[5].mMutex.__data.__list.__next = p_Var1;
      if ((auto_lock.mLock[5].mMutex.__data.__list.__next == (__pthread_internal_list *)0x0) &&
         (_mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                     "mpp_buf_slot_ready",0x3bb), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      init_slot_entry((MppBufSlotsImpl *)auto_lock.mLock,0,
                      *(RK_S32 *)((long)&(auto_lock.mLock)->mMutex + 0x20));
    }
    auto_lock.mLock[2].mMutex.__data.__kind = *(int *)((long)&(auto_lock.mLock)->mMutex + 0x20);
    mpp_frame_copy(auto_lock.mLock[3].mMutex.__data.__list.__prev,
                   auto_lock.mLock[3].mMutex.__data.__list.__next);
    if (auto_lock.mLock[5].mMutex.__data.__list.__prev != (__pthread_internal_list *)0x0) {
      buf_slot_logs_reset((MppBufSlotLogs *)auto_lock.mLock[5].mMutex.__data.__list.__prev);
    }
    *(undefined4 *)((long)&(auto_lock.mLock)->mMutex + 0x18) = 0;
    *(undefined4 *)((long)&(auto_lock.mLock)->mMutex + 0x1c) = 0xffffffff;
    slots_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)local_30);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_ready(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    buf_slot_dbg(BUF_SLOT_DBG_SETUP, "slot %p is ready now\n", slots);

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, impl->slots);
    if (!impl->info_changed)
        mpp_log("found info change ready set without internal info change\n");

    // ready mean the info_set will be copy to info as the new configuration
    if (impl->buf_count != impl->new_count) {
        impl->slots = mpp_realloc(impl->slots, MppBufSlotEntry, impl->new_count);
        mpp_assert(impl->slots);
        init_slot_entry(impl, 0, impl->new_count);
    }
    impl->buf_count = impl->new_count;

    mpp_frame_copy(impl->info, impl->info_set);

    if (impl->logs)
        buf_slot_logs_reset(impl->logs);

    impl->info_changed = 0;
    impl->info_change_slot_idx = -1;
    return MPP_OK;
}